

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int do_sign_async(ptls_buffer_t *outbuf,ptls_async_job_t **_async)

{
  undefined4 uVar1;
  int local_2c;
  ptls_async_job_t *ppStack_28;
  int ret;
  async_sign_ctx *async;
  ptls_async_job_t **_async_local;
  ptls_buffer_t *outbuf_local;
  
  ppStack_28 = *_async;
  async = (async_sign_ctx *)_async;
  _async_local = (ptls_async_job_t **)outbuf;
  uVar1 = ASYNC_start_job(ppStack_28 + 2,ppStack_28[1].set_completion_callback,&local_2c,
                          do_sign_async_job,&stack0xffffffffffffffd8,8);
  switch(uVar1) {
  case 0:
    local_2c = 0x203;
    break;
  case 1:
    local_2c = 0x203;
    break;
  case 2:
    return 0x20b;
  case 3:
    ppStack_28[2].destroy_ = (_func_void_st_ptls_async_job_t_ptr *)0x0;
    local_2c = ptls_buffer__do_pushv
                         ((ptls_buffer_t *)_async_local,&ppStack_28[2].set_completion_callback,
                          (size_t)ppStack_28[2].get_fd);
    if (local_2c == 0) {
      local_2c = 0;
    }
    break;
  default:
    local_2c = 0x203;
  }
  async_sign_ctx_free(ppStack_28);
  (async->super).destroy_ = (_func_void_st_ptls_async_job_t_ptr *)0x0;
  return local_2c;
}

Assistant:

static int do_sign_async(ptls_buffer_t *outbuf, ptls_async_job_t **_async)
{
    struct async_sign_ctx *async = (void *)*_async;
    int ret;

    switch (ASYNC_start_job(&async->job, async->waitctx, &ret, do_sign_async_job, &async, sizeof(async))) {
    case ASYNC_PAUSE:
        return PTLS_ERROR_ASYNC_OPERATION; // async operation inflight; bail out without getting rid of async context
    case ASYNC_ERR:
        ret = PTLS_ERROR_LIBRARY;
        break;
    case ASYNC_NO_JOBS:
        ret = PTLS_ERROR_LIBRARY;
        break;
    case ASYNC_FINISH:
        async->job = NULL;
        ptls_buffer_pushv(outbuf, async->sig, async->siglen);
        ret = 0;
        break;
    default:
        ret = PTLS_ERROR_LIBRARY;
        break;
    }

Exit:
    async_sign_ctx_free(&async->super);
    *_async = NULL;
    return ret;
}